

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenLiteral * BinaryenLiteralFloat32Bits(BinaryenLiteral *__return_storage_ptr__,int32_t x)

{
  Literal local_40;
  Literal local_28;
  int32_t local_c;
  int32_t x_local;
  
  local_c = x;
  wasm::Literal::Literal(&local_40,x);
  wasm::Literal::castToF32(&local_28,&local_40);
  toBinaryenLiteral(__return_storage_ptr__,&local_28);
  wasm::Literal::~Literal(&local_28);
  wasm::Literal::~Literal(&local_40);
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral BinaryenLiteralFloat32Bits(int32_t x) {
  return toBinaryenLiteral(Literal(x).castToF32());
}